

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CounterUnitTest.cpp
# Opt level: O0

bool TestGetTickCount(void)

{
  Counter<unsigned_int,_32U> local_350;
  Counter<unsigned_int,_32U> local_34c;
  Counter<unsigned_int,_32U> local_348;
  Counter<unsigned_int,_32U> local_344;
  Counter<unsigned_int,_32U> local_340;
  Counter<unsigned_int,_32U> local_33c;
  Counter<unsigned_int,_32U> local_338;
  Counter<unsigned_int,_32U> local_334;
  Counter<unsigned_int,_32U> local_330;
  Counter<unsigned_int,_32U> local_32c;
  Counter<unsigned_int,_32U> local_328;
  Counter<unsigned_int,_32U> local_324;
  Counter<unsigned_int,_32U> local_320;
  Counter<unsigned_int,_32U> local_31c;
  Counter<unsigned_int,_32U> local_318;
  Counter<unsigned_int,_32U> local_314;
  Counter<unsigned_int,_32U> local_310;
  Counter<unsigned_int,_32U> local_30c;
  Counter<unsigned_int,_32U> local_308;
  Counter<unsigned_int,_32U> local_304;
  Counter<unsigned_int,_32U> local_300;
  Counter<unsigned_int,_32U> local_2fc;
  Counter<unsigned_int,_32U> local_2f8;
  Counter<unsigned_int,_32U> local_2f4;
  Counter<unsigned_int,_32U> local_2f0;
  Counter<unsigned_int,_32U> local_2ec;
  Counter<unsigned_int,_32U> local_2e8;
  Counter<unsigned_int,_32U> local_2e4;
  Counter<unsigned_int,_32U> local_2e0;
  Counter<unsigned_int,_32U> local_2dc;
  Counter32 t1;
  uint local_2d4;
  Counter<unsigned_int,_32U> local_2d0;
  uint loops;
  Counter32 t;
  Counter<unsigned_int,_32U> local_2c4;
  Counter32 kTimeout;
  Counter32 t0;
  Counter<unsigned_int,_32U> local_2b8;
  int local_2b4;
  Counter<unsigned_int,_32U> local_2b0;
  uint loops_1;
  Counter<unsigned_int,_32U> local_2a8;
  Counter32 kTimeout_1;
  Counter32 t_1;
  uint d_13;
  uint d_10;
  uint d_7;
  uint d_4;
  uint d_1;
  uint d;
  uint d_11;
  uint d_8;
  uint d_5;
  uint d_2;
  uint d_12;
  uint d_9;
  uint d_6;
  uint d_3;
  
  Counter<unsigned_int,_32U>::Counter(&local_2a8,0xffffff00);
  Counter<unsigned_int,_32U>::Counter(&local_2b0,300);
  Counter<unsigned_int,_32U>::Counter
            ((Counter<unsigned_int,_32U> *)&loops_1,local_2a8.Value + local_2b0.Value);
  local_2b4 = 0;
  while (Counter<unsigned_int,_32U>::Counter(&local_2b8,(ThisType *)&loops_1),
        0x7fffffff < local_2a8.Value - local_2b8.Value) {
    Counter<unsigned_int,_32U>::Counter(&t0,10);
    local_2a8.Value = local_2a8.Value + t0.Value;
    local_2b4 = local_2b4 + 1;
  }
  if (local_2b4 == 0x1e) {
    Counter<unsigned_int,_32U>::Counter(&kTimeout,0x2c);
    if (local_2a8.Value == kTimeout.Value) {
      Counter<unsigned_int,_32U>::Counter(&local_2c4,0xffffff00);
      Counter<unsigned_int,_32U>::Counter((Counter<unsigned_int,_32U> *)&loops,300);
      Counter<unsigned_int,_32U>::Counter(&t,local_2c4.Value + loops);
      Counter<unsigned_int,_32U>::Counter(&local_2d0,&local_2c4);
      local_2d4 = 0;
      do {
        local_2d4 = local_2d4 + 1;
        if (0x1e < local_2d4) {
          return false;
        }
        Counter<unsigned_int,_32U>::Counter(&t1,10);
        local_2d0.Value = local_2d0.Value + t1.Value;
        Counter<unsigned_int,_32U>::Counter(&local_2dc,&t);
      } while (0x7fffffff < local_2d0.Value - local_2dc.Value);
      if (local_2d4 == 0x1e) {
        Counter<unsigned_int,_32U>::Counter(&local_2e0,0x2c);
        Counter<unsigned_int,_32U>::Counter(&local_2e4,&local_2e0);
        if (local_2d0.Value == local_2e4.Value) {
          Counter<unsigned_int,_32U>::Counter(&local_2e8,&local_2c4);
          if (local_2e8.Value - local_2e0.Value < 0x80000000) {
            kTimeout_1.Value._3_1_ = false;
          }
          else {
            Counter<unsigned_int,_32U>::Counter(&local_2ec,&local_2c4);
            if (local_2e0.Value - local_2ec.Value < 0x80000000) {
              Counter<unsigned_int,_32U>::Counter(&local_2f0,&local_2e0);
              if (local_2c4.Value - local_2f0.Value < 0x80000000) {
                kTimeout_1.Value._3_1_ = false;
              }
              else {
                Counter<unsigned_int,_32U>::Counter(&local_2f8,&local_2c4);
                Counter<unsigned_int,_32U>::Counter(&local_2f4,local_2e0.Value - local_2f8.Value);
                Counter<unsigned_int,_32U>::Counter(&local_2fc,299);
                if (local_2fc.Value - local_2f4.Value < 0x80000000) {
                  kTimeout_1.Value._3_1_ = false;
                }
                else {
                  Counter<unsigned_int,_32U>::Counter(&local_304,&local_2c4);
                  Counter<unsigned_int,_32U>::Counter(&local_300,local_2e0.Value - local_304.Value);
                  Counter<unsigned_int,_32U>::Counter(&local_308,300);
                  if (local_300.Value - local_308.Value < 0x80000000) {
                    Counter<unsigned_int,_32U>::Counter(&local_310,&local_2c4);
                    Counter<unsigned_int,_32U>::Counter
                              (&local_30c,local_2e0.Value - local_310.Value);
                    Counter<unsigned_int,_32U>::Counter(&local_314,0x12d);
                    if (local_30c.Value - local_314.Value < 0x80000000) {
                      kTimeout_1.Value._3_1_ = false;
                    }
                    else {
                      Counter<unsigned_int,_32U>::Counter(&local_31c,299);
                      Counter<unsigned_int,_32U>::Counter
                                (&local_318,local_2c4.Value + local_31c.Value);
                      if (local_318.Value - local_2e0.Value < 0x80000000) {
                        kTimeout_1.Value._3_1_ = false;
                      }
                      else {
                        Counter<unsigned_int,_32U>::Counter(&local_324,300);
                        Counter<unsigned_int,_32U>::Counter
                                  (&local_320,local_2c4.Value + local_324.Value);
                        if (local_2e0.Value - local_320.Value < 0x80000000) {
                          Counter<unsigned_int,_32U>::Counter(&local_32c,0x12d);
                          Counter<unsigned_int,_32U>::Counter
                                    (&local_328,local_2c4.Value + local_32c.Value);
                          if (local_2e0.Value - local_328.Value < 0x80000000) {
                            kTimeout_1.Value._3_1_ = false;
                          }
                          else {
                            Counter<unsigned_int,_32U>::Counter(&local_334,299);
                            Counter<unsigned_int,_32U>::Counter
                                      (&local_330,local_2e0.Value - local_334.Value);
                            Counter<unsigned_int,_32U>::Counter(&local_338,&local_2c4);
                            if (local_338.Value - local_330.Value < 0x80000000) {
                              kTimeout_1.Value._3_1_ = false;
                            }
                            else {
                              Counter<unsigned_int,_32U>::Counter(&local_340,300);
                              Counter<unsigned_int,_32U>::Counter
                                        (&local_33c,local_2e0.Value - local_340.Value);
                              Counter<unsigned_int,_32U>::Counter(&local_344,&local_2c4);
                              if (local_33c.Value - local_344.Value < 0x80000000) {
                                Counter<unsigned_int,_32U>::Counter(&local_34c,0x12d);
                                Counter<unsigned_int,_32U>::Counter
                                          (&local_348,local_2e0.Value - local_34c.Value);
                                Counter<unsigned_int,_32U>::Counter(&local_350,&local_2c4);
                                if (local_348.Value - local_350.Value < 0x80000000) {
                                  kTimeout_1.Value._3_1_ = false;
                                }
                                else {
                                  kTimeout_1.Value._3_1_ = true;
                                }
                              }
                              else {
                                kTimeout_1.Value._3_1_ = false;
                              }
                            }
                          }
                        }
                        else {
                          kTimeout_1.Value._3_1_ = false;
                        }
                      }
                    }
                  }
                  else {
                    kTimeout_1.Value._3_1_ = false;
                  }
                }
              }
            }
            else {
              kTimeout_1.Value._3_1_ = false;
            }
          }
        }
        else {
          kTimeout_1.Value._3_1_ = false;
        }
      }
      else {
        kTimeout_1.Value._3_1_ = false;
      }
    }
    else {
      kTimeout_1.Value._3_1_ = false;
    }
  }
  else {
    kTimeout_1.Value._3_1_ = false;
  }
  return kTimeout_1.Value._3_1_;
}

Assistant:

bool TestGetTickCount()
{
    // Example from README:
    {
        //Counter32 t = ::GetTickCount();
        Counter32 t = 0xffffff00;
        Counter32 kTimeout = t + 300; // Wait for 300 ms
	    // kTimeout == 0x0000002c here.

        unsigned loops = 0;
        while (t < kTimeout)
        {
		    //::Sleep(10);
		    //t = ::GetTickCount();
		    t += 10;
            ++loops;
        }

        TEST_CHECK(loops == 30);
        TEST_CHECK(t == 0x0000002c);
    }

    //Counter32 t0 = ::GetTickCount();
    Counter32 t0 = 0xffffff00;
    Counter32 kTimeout = t0 + 300;

    Counter32 t = t0;
    unsigned loops = 0;
    do
    {
        ++loops;
        TEST_CHECK(loops <= 30);

        //::Sleep(10);
        t += 10;

    } while (t < kTimeout);

    TEST_CHECK(loops == 30);

    //Counter32 t1 = ::GetTickCount();
    Counter32 t1 = 0x0000002c;

    TEST_CHECK(t == t1);

    // Test the cases where normal integers fall down:

    TEST_CHECK(t1 > t0);
    TEST_CHECK(t1 >= t0);
    TEST_CHECK(t0 < t1);

    // Test some other common ways to check for an elapsed timer:

    TEST_CHECK(t1 - t0 > 299);
    TEST_CHECK(t1 - t0 >= 300);
    TEST_CHECK(t1 - t0 < 301);

    TEST_CHECK(t1 > t0 + 299);
    TEST_CHECK(t1 >= t0 + 300);
    TEST_CHECK(t1 < t0 + 301);

    TEST_CHECK(t1 - 299 > t0);
    TEST_CHECK(t1 - 300 >= t0);
    TEST_CHECK(t1 - 301 < t0);

    return true;
}